

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

TransListCoverageBinInitializerSyntax * __thiscall
slang::parsing::Parser::parseTransListInitializer(Parser *this)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  bool bVar1;
  TransListCoverageBinInitializerSyntax *pTVar2;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  undefined8 *in_RDI;
  Token TVar3;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  SeparatedSyntaxList<slang::syntax::TransSetSyntax> *in_stack_fffffffffffffe38;
  SeparatedSyntaxList<slang::syntax::TransSetSyntax> *in_stack_fffffffffffffe40;
  undefined6 in_stack_fffffffffffffe48;
  undefined6 uVar4;
  TokenKind in_stack_fffffffffffffe4e;
  undefined2 uVar5;
  ParserBase *in_stack_fffffffffffffe50;
  ParserBase *in_stack_fffffffffffffe60;
  Parser *in_stack_ffffffffffffff18;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_e0 [4];
  
  SmallVector<slang::syntax::TokenOrSyntax,_8UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0x5edce9);
  while( true ) {
    parseTransSet(in_stack_ffffffffffffff18);
    slang::syntax::TokenOrSyntax::TokenOrSyntax
              ((TokenOrSyntax *)in_stack_fffffffffffffe40,(SyntaxNode *)in_stack_fffffffffffffe38);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
              ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)in_stack_fffffffffffffe40,
               (TokenOrSyntax *)in_stack_fffffffffffffe38);
    bVar1 = ParserBase::peek(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4e);
    if (!bVar1) break;
    TVar3 = ParserBase::consume(in_stack_fffffffffffffe60);
    in_stack_fffffffffffffe60 = (ParserBase *)TVar3.info;
    TVar3.rawLen._2_2_ = in_stack_fffffffffffffe4e;
    TVar3._0_6_ = in_stack_fffffffffffffe48;
    TVar3.info = (Info *)in_stack_fffffffffffffe50;
    slang::syntax::TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_stack_fffffffffffffe40,TVar3);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
              ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)in_stack_fffffffffffffe40,
               (TokenOrSyntax *)in_stack_fffffffffffffe38);
  }
  uVar4 = SUB86(in_RDI + 0x1c,0);
  uVar5 = (undefined2)((ulong)(in_RDI + 0x1c) >> 0x30);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::copy(local_e0,(EVP_PKEY_CTX *)*in_RDI,src);
  elements._M_ptr._6_2_ = uVar5;
  elements._M_ptr._0_6_ = uVar4;
  elements._M_extent._M_extent_value = extraout_RDX._M_extent_value;
  slang::syntax::SeparatedSyntaxList<slang::syntax::TransSetSyntax>::SeparatedSyntaxList
            (in_stack_fffffffffffffe40,elements);
  pTVar2 = slang::syntax::SyntaxFactory::transListCoverageBinInitializer
                     ((SyntaxFactory *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  SmallVector<slang::syntax::TokenOrSyntax,_8UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0x5ede59);
  return pTVar2;
}

Assistant:

TransListCoverageBinInitializerSyntax& Parser::parseTransListInitializer() {
    SmallVector<TokenOrSyntax, 8> buffer;
    while (true) {
        buffer.push_back(&parseTransSet());
        if (!peek(TokenKind::Comma))
            break;

        buffer.push_back(consume());
    }

    return factory.transListCoverageBinInitializer(buffer.copy(alloc));
}